

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool array_container_is_subset_bitset(array_container_t *container1,bitset_container_t *container2)

{
  ushort *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = container1->cardinality;
  uVar3 = 0;
  if (container2->cardinality == -1 || (int)uVar2 <= container2->cardinality) {
    uVar4 = 0;
    if (0 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    do {
      if (uVar4 == uVar3) {
        return (long)(int)uVar2 <= (long)uVar3;
      }
      puVar1 = container1->array + uVar3;
      uVar3 = uVar3 + 1;
    } while ((container2->words[*puVar1 >> 6] >> ((ulong)*puVar1 & 0x3f) & 1) != 0);
  }
  return false;
}

Assistant:

bool array_container_is_subset_bitset(const array_container_t* container1,
                                      const bitset_container_t* container2) {
    if (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container2->cardinality < container1->cardinality) {
            return false;
        }
    }
    for (int i = 0; i < container1->cardinality; ++i) {
        if (!bitset_container_contains(container2, container1->array[i])) {
            return false;
        }
    }
    return true;
}